

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O0

void wasm::handleUnreachable(Block *block,Breakability breakability)

{
  bool bVar1;
  size_t sVar2;
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *this;
  Expression **ppEVar3;
  Name target;
  Type local_68;
  Expression *local_60;
  Expression **local_58;
  BasicType local_4c;
  Expression *local_48;
  Expression *child;
  Iterator __end1;
  Iterator __begin1;
  ExpressionList *__range1;
  BranchSeeker *pBStack_10;
  Breakability breakability_local;
  Block *block_local;
  
  __range1._0_4_ = 1;
  __range1._4_4_ = breakability;
  pBStack_10 = (BranchSeeker *)block;
  bVar1 = Type::operator==(&(block->super_SpecificExpression<(wasm::Expression::Id)1>).
                            super_Expression.type,(BasicType *)&__range1);
  if (((!bVar1) &&
      (sVar2 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                         ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                          ((pBStack_10->
                           super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                           ).
                           super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                           .stack.fixed._M_elems + 1)), sVar2 != 0)) &&
     (bVar1 = Type::isConcrete((Type *)&(pBStack_10->
                                        super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                                        ).
                                        super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                                        .stack), !bVar1)) {
    this = (ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
           ((pBStack_10->
            super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
            ).
            super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
            .stack.fixed._M_elems + 1);
    join_0x00000010_0x00000000_ =
         ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::begin(this);
    _child = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::end(this);
    while (bVar1 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                   operator!=((Iterator *)&__end1.index,(Iterator *)&child), bVar1) {
      ppEVar3 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                operator*((Iterator *)&__end1.index);
      local_48 = *ppEVar3;
      local_4c = unreachable;
      bVar1 = Type::operator==(&local_48->type,&local_4c);
      if (bVar1) {
        if (__range1._4_4_ == Unknown) {
          local_60 = (Expression *)
                     (pBStack_10->
                     super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                     ).
                     super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                     .stack.fixed._M_elems[0].func;
          local_58 = (pBStack_10->
                     super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                     ).
                     super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                     .stack.fixed._M_elems[0].currp;
          target.super_IString.str._M_str = (char *)local_60;
          target.super_IString.str._M_len = (size_t)local_58;
          bVar1 = BranchUtils::BranchSeeker::has(pBStack_10,local_60,target);
          __range1._4_4_ = NoBreak;
          if (bVar1) {
            __range1._4_4_ = HasBreak;
          }
        }
        if (__range1._4_4_ != NoBreak) {
          return;
        }
        Type::Type(&local_68,unreachable);
        (pBStack_10->
        super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
        ).
        super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
        .stack.usedFixed = local_68.id;
        return;
      }
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::operator++
                ((Iterator *)&__end1.index);
    }
  }
  return;
}

Assistant:

static void handleUnreachable(Block* block, Block::Breakability breakability) {
  if (block->type == Type::unreachable) {
    return; // nothing to do
  }
  if (block->list.size() == 0) {
    return; // nothing to do
  }
  // if we are concrete, stop - even an unreachable child
  // won't change that (since we have a break with a value,
  // or the final child flows out a value)
  if (block->type.isConcrete()) {
    return;
  }
  // look for an unreachable child
  for (auto* child : block->list) {
    if (child->type == Type::unreachable) {
      // there is an unreachable child, so we are unreachable, unless we have a
      // break
      if (breakability == Block::Unknown) {
        breakability = BranchUtils::BranchSeeker::has(block, block->name)
                         ? Block::HasBreak
                         : Block::NoBreak;
      }
      if (breakability == Block::NoBreak) {
        block->type = Type::unreachable;
      }
      return;
    }
  }
}